

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

void Abc_NtkTransferPointers(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkAig)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Ivy_Obj_t *p;
  Ivy_Obj_t *pIVar4;
  int local_34;
  int i;
  Ivy_Obj_t *pObjFraig;
  Ivy_Obj_t *pObjIvy;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkAig_local;
  Abc_Ntk_t *pNtk_local;
  
  pAVar2 = Abc_AigConst1(pNtk);
  pAVar3 = Abc_AigConst1(pNtkAig);
  (pAVar2->field_6).pCopy = pAVar3;
  for (local_34 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = Abc_NtkCi(pNtk,local_34);
    pAVar3 = Abc_NtkCi(pNtkAig,local_34);
    (pAVar2->field_6).pCopy = pAVar3;
  }
  for (local_34 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = Abc_NtkCo(pNtk,local_34);
    pAVar3 = Abc_NtkCo(pNtkAig,local_34);
    (pAVar2->field_6).pCopy = pAVar3;
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = Abc_NtkBox(pNtk,local_34);
    iVar1 = Abc_ObjIsLatch(pAVar2);
    if (iVar1 != 0) {
      pAVar3 = Abc_NtkBox(pNtkAig,local_34);
      (pAVar2->field_6).pCopy = pAVar3;
    }
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = Abc_NtkObj(pNtk,local_34);
    if ((((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) &&
        ((Ivy_Obj_t *)(pAVar2->field_6).pCopy != (Ivy_Obj_t *)0x0)) &&
       (p = Ivy_ObjEquiv((Ivy_Obj_t *)(pAVar2->field_6).pCopy), p != (Ivy_Obj_t *)0x0)) {
      pIVar4 = Ivy_Regular(p);
      pAVar3 = Abc_EdgeToNode(pNtkAig,pIVar4->TravId);
      (pAVar2->field_6).pCopy = pAVar3;
      pAVar3 = (pAVar2->field_6).pCopy;
      iVar1 = Ivy_IsComplement(p);
      pAVar3 = Abc_ObjNotCond(pAVar3,iVar1);
      (pAVar2->field_6).pCopy = pAVar3;
    }
  }
  return;
}

Assistant:

void Abc_NtkTransferPointers( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkAig )
{
    Abc_Obj_t * pObj;
    Ivy_Obj_t * pObjIvy, * pObjFraig;
    int i;
    pObj = Abc_AigConst1(pNtk);
    pObj->pCopy = Abc_AigConst1(pNtkAig);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkCi(pNtkAig, i);
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkCo(pNtkAig, i);
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkBox(pNtkAig, i);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObjIvy = (Ivy_Obj_t *)pObj->pCopy;
        if ( pObjIvy == NULL )
            continue;
        pObjFraig = Ivy_ObjEquiv( pObjIvy );
        if ( pObjFraig == NULL )
            continue;
        pObj->pCopy = Abc_EdgeToNode( pNtkAig, Ivy_Regular(pObjFraig)->TravId );
        pObj->pCopy = Abc_ObjNotCond( pObj->pCopy, Ivy_IsComplement(pObjFraig) );
    }
}